

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv.cc
# Opt level: O2

Dim * __thiscall
cnn::FoldRows::dim_forward
          (Dim *__return_storage_ptr__,FoldRows *this,
          vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  pointer pDVar1;
  uint uVar2;
  ostream *poVar3;
  invalid_argument *this_00;
  initializer_list<unsigned_int> x;
  uint local_18;
  uint local_14;
  
  pDVar1 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = pDVar1->d[0] / this->nrows;
  if (((this->nrows * uVar2 == pDVar1->d[0]) &&
      ((long)(xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
             super__Vector_impl_data._M_finish - (long)pDVar1 == 0x24)) && (pDVar1->nd == 2)) {
    _local_18 = CONCAT44(pDVar1->d[1],uVar2);
    x._M_len = 2;
    x._M_array = &local_18;
    Dim::Dim(__return_storage_ptr__,x);
    return __return_storage_ptr__;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"Bad input dimensions in FoldRows: ");
  poVar3 = operator<<(poVar3,xs);
  std::endl<char,std::char_traits<char>>(poVar3);
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"bad input dimensions in FoldRows");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Dim FoldRows::dim_forward(const vector<Dim>& xs) const {
  unsigned orows = xs[0].rows() / nrows;
  if ((orows * nrows != xs[0].rows()) || xs.size() != 1 || xs[0].ndims() != 2) {
    cerr << "Bad input dimensions in FoldRows: " << xs << endl;
    throw std::invalid_argument("bad input dimensions in FoldRows");
  }
  return Dim({orows, xs[0].cols()});
}